

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O3

ostream * smf::operator<<(ostream *out,MidiMessage *message)

{
  ostream *poVar1;
  long lVar2;
  undefined8 in_RAX;
  pointer puVar3;
  int iVar4;
  long lVar5;
  undefined8 uStack_38;
  
  puVar3 = (message->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < *(int *)&(message->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (int)puVar3) {
    lVar5 = 0;
    uStack_38 = in_RAX;
    do {
      if ((char)puVar3[lVar5] < '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(out,"0x",2);
        lVar2 = *(long *)out;
        *(uint *)(out + *(long *)(lVar2 + -0x18) + 0x18) =
             *(uint *)(out + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 0x10) = 2;
        poVar1 = out + *(long *)(lVar2 + -0x18);
        if (out[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
          std::ios::widen((char)poVar1);
          poVar1[0xe1] = (ostream)0x1;
        }
        poVar1[0xe0] = (ostream)0x30;
        std::ostream::operator<<
                  ((ostream *)out,
                   (uint)(message->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar5]);
        lVar2 = *(long *)out;
        *(uint *)(out + *(long *)(lVar2 + -0x18) + 0x18) =
             *(uint *)(out + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
        *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 0x10) = 0;
        poVar1 = out + *(long *)(lVar2 + -0x18);
        if (out[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
          std::ios::widen((char)poVar1);
          poVar1[0xe1] = (ostream)0x1;
        }
        poVar1[0xe0] = (ostream)0x20;
      }
      else {
        std::ostream::operator<<((ostream *)out,(int)(char)puVar3[lVar5]);
      }
      puVar3 = (message->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar4 = (int)(message->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (int)puVar3;
      if (lVar5 < iVar4 + -1) {
        uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_38 + 7),1);
        puVar3 = (message->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4 = (int)(message->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (int)puVar3;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar4);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, MidiMessage& message) {
	for (int i=0; i<(int)message.size(); i++) {
		if (message[i] >= 0x80) {
			out << "0x" << std::hex << std::setw(2) << std::setfill('0') << (int)message[i];
			out << std::dec << std::setw(0) << std::setfill(' ');
		} else {
			out << (int)message[i];
		}
		if (i<(int)message.size() - 1) {
			out << ' ';
		}
	}
	return out;
}